

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O3

int __thiscall ncnn::Crop::load_param(Crop *this,ParamDict *pd)

{
  void *pvVar1;
  Allocator *pAVar2;
  int iVar3;
  int *piVar4;
  bool bVar5;
  Mat local_a8;
  Mat local_68;
  
  iVar3 = ParamDict::get(pd,0,0);
  this->woffset = iVar3;
  iVar3 = ParamDict::get(pd,1,0);
  this->hoffset = iVar3;
  iVar3 = ParamDict::get(pd,2,0);
  this->coffset = iVar3;
  iVar3 = ParamDict::get(pd,3,0);
  this->outw = iVar3;
  iVar3 = ParamDict::get(pd,4,0);
  this->outh = iVar3;
  iVar3 = ParamDict::get(pd,5,0);
  this->outc = iVar3;
  iVar3 = ParamDict::get(pd,6,0);
  this->woffset2 = iVar3;
  iVar3 = ParamDict::get(pd,7,0);
  this->hoffset2 = iVar3;
  iVar3 = ParamDict::get(pd,8,0);
  this->coffset2 = iVar3;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.c = 0;
  local_68.cstep = 0;
  ParamDict::get(&local_a8,pd,9,&local_68);
  piVar4 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
  if (&this->starts != &local_a8) {
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->starts).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar1 = (this->starts).data;
        pAVar2 = (this->starts).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
        }
        else {
          (**(code **)(*(long *)pAVar2 + 0x18))();
        }
      }
    }
    (this->starts).data = local_a8.data;
    piVar4 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    (this->starts).refcount = piVar4;
    (this->starts).elemsize = CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
    (this->starts).elempack = local_a8.elempack;
    (this->starts).allocator = local_a8.allocator;
    (this->starts).dims = local_a8.dims;
    (this->starts).w = local_a8.w;
    (this->starts).h = local_a8.h;
    (this->starts).c = local_a8.c;
    (this->starts).cstep = local_a8.cstep;
  }
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if (local_a8.data != (void *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_a8.allocator + 0x18))();
      }
    }
  }
  local_a8.elemsize._0_4_ = 0;
  local_a8.elemsize._4_4_ = 0;
  local_a8.elempack = 0;
  local_a8.data = (void *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.dims = 0;
  local_a8.w = 0;
  local_a8.h = 0;
  local_a8.c = 0;
  local_a8.cstep = 0;
  piVar4 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_68.allocator == (Allocator *)0x0) {
        if (local_68.data != (void *)0x0) {
          free(local_68.data);
        }
      }
      else {
        (**(code **)(*(long *)local_68.allocator + 0x18))();
      }
    }
  }
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.c = 0;
  local_68.cstep = 0;
  ParamDict::get(&local_a8,pd,10,&local_68);
  piVar4 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
  if (&this->ends != &local_a8) {
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->ends).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar1 = (this->ends).data;
        pAVar2 = (this->ends).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
        }
        else {
          (**(code **)(*(long *)pAVar2 + 0x18))();
        }
      }
    }
    (this->ends).data = local_a8.data;
    piVar4 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    (this->ends).refcount = piVar4;
    (this->ends).elemsize = CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
    (this->ends).elempack = local_a8.elempack;
    (this->ends).allocator = local_a8.allocator;
    (this->ends).dims = local_a8.dims;
    (this->ends).w = local_a8.w;
    (this->ends).h = local_a8.h;
    (this->ends).c = local_a8.c;
    (this->ends).cstep = local_a8.cstep;
  }
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if (local_a8.data != (void *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_a8.allocator + 0x18))();
      }
    }
  }
  local_a8.elemsize._0_4_ = 0;
  local_a8.elemsize._4_4_ = 0;
  local_a8.elempack = 0;
  local_a8.data = (void *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.dims = 0;
  local_a8.w = 0;
  local_a8.h = 0;
  local_a8.c = 0;
  local_a8.cstep = 0;
  piVar4 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_68.allocator == (Allocator *)0x0) {
        if (local_68.data != (void *)0x0) {
          free(local_68.data);
        }
      }
      else {
        (**(code **)(*(long *)local_68.allocator + 0x18))();
      }
    }
  }
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.c = 0;
  local_68.cstep = 0;
  ParamDict::get(&local_a8,pd,0xb,&local_68);
  piVar4 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
  if (&this->axes != &local_a8) {
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->axes).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar1 = (this->axes).data;
        pAVar2 = (this->axes).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
        }
        else {
          (**(code **)(*(long *)pAVar2 + 0x18))();
        }
      }
    }
    (this->axes).data = local_a8.data;
    piVar4 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    (this->axes).refcount = piVar4;
    (this->axes).elemsize = CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
    (this->axes).elempack = local_a8.elempack;
    (this->axes).allocator = local_a8.allocator;
    (this->axes).dims = local_a8.dims;
    (this->axes).w = local_a8.w;
    (this->axes).h = local_a8.h;
    (this->axes).c = local_a8.c;
    (this->axes).cstep = local_a8.cstep;
  }
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if (local_a8.data != (void *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_a8.allocator + 0x18))();
      }
    }
  }
  local_a8.elemsize._0_4_ = 0;
  local_a8.elemsize._4_4_ = 0;
  local_a8.elempack = 0;
  local_a8.data = (void *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.dims = 0;
  local_a8.w = 0;
  local_a8.h = 0;
  local_a8.c = 0;
  local_a8.cstep = 0;
  piVar4 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_68.allocator == (Allocator *)0x0) {
        if (local_68.data != (void *)0x0) {
          free(local_68.data);
        }
      }
      else {
        (**(code **)(*(long *)local_68.allocator + 0x18))();
      }
    }
  }
  if ((this->starts).data == (void *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = false;
    if (((long)(this->starts).c * (this->starts).cstep != 0) && ((this->ends).data != (void *)0x0))
    {
      bVar5 = (long)(this->ends).c * (this->ends).cstep != 0;
    }
  }
  if ((((!bVar5) && (this->outw == 0)) && (this->outh == 0)) && (this->outc == 0)) {
    (this->super_Layer).one_blob_only = false;
  }
  return 0;
}

Assistant:

int Crop::load_param(const ParamDict& pd)
{
    woffset = pd.get(0, 0);
    hoffset = pd.get(1, 0);
    coffset = pd.get(2, 0);
    outw = pd.get(3, 0);
    outh = pd.get(4, 0);
    outc = pd.get(5, 0);
    woffset2 = pd.get(6, 0);
    hoffset2 = pd.get(7, 0);
    coffset2 = pd.get(8, 0);

    starts = pd.get(9, Mat());
    ends = pd.get(10, Mat());
    axes = pd.get(11, Mat());

    bool numpy_style_slice = !starts.empty() && !ends.empty();

    if (outw == 0 && outh == 0 && outc == 0 && !numpy_style_slice)
    {
        one_blob_only = false;
    }

    return 0;
}